

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpdf-ctest.c
# Opt level: O0

void test33(char *infile,char *password,char *outfile,char *xarg)

{
  qpdf_data p_Var1;
  int iVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  qpdf_oh procset;
  qpdf_oh resources;
  qpdf_oh i_mediabox;
  qpdf_oh mediabox;
  qpdf_oh page1;
  qpdf_oh kids;
  qpdf_oh pages;
  qpdf_oh root;
  char *xarg_local;
  char *outfile_local;
  char *password_local;
  char *infile_local;
  
  iVar2 = qpdf_read(qpdf,infile,password);
  if (iVar2 != 0) {
    __assert_fail("qpdf_read(qpdf, infile, password) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/qpdf-ctest.c"
                  ,0x3d6,"void test33(const char *, const char *, const char *, const char *)");
  }
  uVar3 = qpdf_get_root(qpdf);
  uVar3 = qpdf_oh_get_key(qpdf,uVar3,"/Pages");
  uVar3 = qpdf_oh_get_key(qpdf,uVar3,"/Kids");
  uVar3 = qpdf_oh_get_array_item(qpdf,uVar3,0);
  uVar4 = qpdf_oh_get_key(qpdf,uVar3,"/MediaBox");
  iVar2 = qpdf_oh_is_indirect(qpdf,uVar4);
  if (iVar2 != 0) {
    __assert_fail("!qpdf_oh_is_indirect(qpdf, mediabox)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/qpdf-ctest.c"
                  ,0x3dc,"void test33(const char *, const char *, const char *, const char *)");
  }
  uVar4 = qpdf_make_indirect_object(qpdf,uVar4);
  iVar2 = qpdf_oh_is_indirect(qpdf,uVar4);
  if (iVar2 == 0) {
    __assert_fail("qpdf_oh_is_indirect(qpdf, i_mediabox)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/qpdf-ctest.c"
                  ,0x3de,"void test33(const char *, const char *, const char *, const char *)");
  }
  qpdf_oh_replace_key(qpdf,uVar3,"/MediaBox",uVar4);
  uVar3 = qpdf_oh_get_key(qpdf,uVar3,"/Resources");
  uVar3 = qpdf_oh_get_key(qpdf,uVar3,"/ProcSet");
  iVar2 = qpdf_oh_is_indirect(qpdf,uVar3);
  p_Var1 = qpdf;
  if (iVar2 != 0) {
    uVar4 = qpdf_oh_get_object_id(qpdf,uVar3);
    uVar3 = qpdf_oh_get_generation(qpdf,uVar3);
    uVar5 = qpdf_oh_parse(qpdf,"[/PDF]");
    qpdf_replace_object(p_Var1,uVar4,uVar3,uVar5);
    qpdf_init_write(qpdf,outfile);
    qpdf_set_static_ID(qpdf,1);
    qpdf_set_qdf_mode(qpdf,1);
    qpdf_set_suppress_original_object_IDs(qpdf,1);
    qpdf_write(qpdf);
    report_errors();
    return;
  }
  __assert_fail("qpdf_oh_is_indirect(qpdf, procset)",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/qpdf-ctest.c"
                ,0x3e4,"void test33(const char *, const char *, const char *, const char *)");
}

Assistant:

static void
test33(char const* infile, char const* password, char const* outfile, char const* xarg)
{
    /* This test case is designed for minimal.pdf. */

    /* Convert a direct object to an indirect object and replace it. */
    assert(qpdf_read(qpdf, infile, password) == 0);
    qpdf_oh root = qpdf_get_root(qpdf);
    qpdf_oh pages = qpdf_oh_get_key(qpdf, root, "/Pages");
    qpdf_oh kids = qpdf_oh_get_key(qpdf, pages, "/Kids");
    qpdf_oh page1 = qpdf_oh_get_array_item(qpdf, kids, 0);
    qpdf_oh mediabox = qpdf_oh_get_key(qpdf, page1, "/MediaBox");
    assert(!qpdf_oh_is_indirect(qpdf, mediabox));
    qpdf_oh i_mediabox = qpdf_make_indirect_object(qpdf, mediabox);
    assert(qpdf_oh_is_indirect(qpdf, i_mediabox));
    qpdf_oh_replace_key(qpdf, page1, "/MediaBox", i_mediabox);

    /* Replace a different indirect object */
    qpdf_oh resources = qpdf_oh_get_key(qpdf, page1, "/Resources");
    qpdf_oh procset = qpdf_oh_get_key(qpdf, resources, "/ProcSet");
    assert(qpdf_oh_is_indirect(qpdf, procset));
    qpdf_replace_object(
        qpdf,
        qpdf_oh_get_object_id(qpdf, procset),
        qpdf_oh_get_generation(qpdf, procset),
        qpdf_oh_parse(qpdf, "[/PDF]"));

    qpdf_init_write(qpdf, outfile);
    qpdf_set_static_ID(qpdf, QPDF_TRUE);
    qpdf_set_qdf_mode(qpdf, QPDF_TRUE);
    qpdf_set_suppress_original_object_IDs(qpdf, QPDF_TRUE);
    qpdf_write(qpdf);
    report_errors();
}